

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modifiers.hpp
# Opt level: O0

values * __thiscall
pstore::command_line::
values<pstore::command_line::literal,pstore::command_line::literal,pstore::command_line::literal>
          (values *__return_storage_ptr__,command_line *this,literal *options,literal *options_1,
          literal *options_2)

{
  initializer_list<pstore::command_line::literal> options_00;
  literal *local_140;
  literal local_110;
  literal local_c8;
  literal local_80;
  literal *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  literal *options_local_2;
  literal *options_local_1;
  literal *options_local;
  
  local_28 = (undefined1  [8])options_1;
  options_local_2 = options;
  options_local_1 = (literal *)this;
  options_local = (literal *)__return_storage_ptr__;
  literal::literal(&local_110,(literal *)this);
  literal::literal(&local_c8,options_local_2);
  literal::literal(&local_80,(literal *)local_28);
  local_30 = 3;
  options_00._M_len = 3;
  options_00._M_array = &local_110;
  local_38 = &local_110;
  details::values::values(__return_storage_ptr__,options_00);
  local_140 = (literal *)&local_38;
  do {
    local_140 = local_140 + -1;
    literal::~literal(local_140);
  } while (local_140 != &local_110);
  return __return_storage_ptr__;
}

Assistant:

details::values values (OptsTy &&... options) {
            return details::values{std::forward<OptsTy> (options)...};
        }